

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O2

int AF_A_BellReset2(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  VM_UBYTE VVar2;
  DObject *this;
  bool bVar3;
  char *__assertion;
  DObject *this_00;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053ebaa;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (DObject *)0x0) {
LAB_0053eafc:
        this_00 = (DObject *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053ebaa;
        }
      }
      if (numparam == 1) goto LAB_0053eb6a;
      VVar2 = param[1].field_0.field_3.Type;
      if (VVar2 != 0xff) {
        if (VVar2 != '\x03') goto LAB_0053eb9a;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053ebaa;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053eb9a;
      }
      if ((((uint)numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
         ((VVar2 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053eb6a:
        *(uint *)&this_00[9].field_0x24 = *(uint *)&this_00[9].field_0x24 & 0xffeffffb | 4;
        pbVar1 = (byte *)((long)&this_00[10].ObjNext + 2);
        *pbVar1 = *pbVar1 & 0xfb;
        *(undefined4 *)((long)&this_00[0xb].ObjNext + 4) = 5;
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053ebaa;
    }
    if (this_00 == (DObject *)0x0) goto LAB_0053eafc;
  }
LAB_0053eb9a:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053ebaa:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0x182,"int AF_A_BellReset2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_BellReset2)
{
	PARAM_ACTION_PROLOGUE;

	self->flags |= MF_SHOOTABLE;
	self->flags &= ~MF_CORPSE;
	self->flags6 &= ~MF6_KILLED;
	self->health = 5;
	return 0;
}